

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_complicatedMultiplicationFactorUnits_Test::~Units_complicatedMultiplicationFactorUnits_Test
          (Units_complicatedMultiplicationFactorUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, complicatedMultiplicationFactorUnits)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");

    libcellml::UnitsPtr u1 = libcellml::Units::create("u1");
    u1->addUnit("u", "milli", 2.0, 1000.0); // u1 = u^2
    u1->addUnit("dimensionless");

    libcellml::UnitsPtr u2 = libcellml::Units::create("u2");
    u2->addUnit("u", "kilo", 2.0, 0.001); // u2 = u^2
    u2->addUnit("dimensionless");

    libcellml::UnitsPtr u3 = libcellml::Units::create("u3");
    u3->addUnit("u", "kilo", 4.0, 0.001); // u3 = u^4

    libcellml::UnitsPtr u4 = libcellml::Units::create("u4");
    u4->addUnit("u2", 2.0); // u4 = u^4

    libcellml::UnitsPtr apple = libcellml::Units::create("apple");
    libcellml::UnitsPtr banana = libcellml::Units::create("banana");

    libcellml::UnitsPtr bushell_of_apples = libcellml::Units::create("bushell_of_apples");
    bushell_of_apples->addUnit("apple", "mega", 1.0, 1000.0); // 1000*mega*apple^1

    libcellml::UnitsPtr square_apple = libcellml::Units::create("square_apple");
    square_apple->addUnit("apple", 2.0);

    libcellml::UnitsPtr incredible_pile_of_square_apples = libcellml::Units::create("incredible_pile_of_square_apples");
    incredible_pile_of_square_apples->addUnit("square_apple", "mega", 1.0, 100.0);

    libcellml::UnitsPtr bunch_of_bananas = libcellml::Units::create("bunch_of_bananas");
    bunch_of_bananas->addUnit("banana", 1, 1.0, 1.0); // 10 bananas

    model->setName("model");
    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);
    model->addUnits(u3);
    model->addUnits(u4);
    model->addUnits(bushell_of_apples);
    model->addUnits(apple);
    model->addUnits(banana);
    model->addUnits(square_apple);
    model->addUnits(incredible_pile_of_square_apples);
    model->addUnits(bunch_of_bananas);

    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(1.0, libcellml::Units::scalingFactor(u3, u4));
    EXPECT_EQ(1e-08, libcellml::Units::scalingFactor(incredible_pile_of_square_apples, square_apple));
    // Incompatible units so we return a scaling factor of 0.0.
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(incredible_pile_of_square_apples, bunch_of_bananas));
}